

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O3

filepos_t __thiscall
libmatroska::KaxInternalBlock::ReadData
          (KaxInternalBlock *this,IOCallback *input,ScopeMode ReadFully)

{
  pointer *pppDVar1;
  vector<int,_std::allocator<int>_> *this_00;
  uint32 uVar2;
  iterator iVar3;
  undefined1 auVar4 [16];
  KaxInternalBlock *pKVar5;
  undefined1 uVar6;
  byte bVar7;
  ushort uVar8;
  uint16 uVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var_00;
  filepos_t fVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined7 extraout_var;
  undefined4 extraout_var_04;
  uint64 uVar13;
  int64 iVar14;
  pointer piVar15;
  size_t sVar16;
  DataBuffer *pDVar17;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  EndOfStreamX *pEVar18;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  LacingType LVar19;
  ulong uVar20;
  int *piVar21;
  binary *pbVar22;
  uint uVar23;
  binary *pbVar24;
  uint uVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  binary *pbVar29;
  byte bVar30;
  vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>> *pvVar31;
  ushort *puVar32;
  binary *pbVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  uint32 SizeRead;
  uint64 SizeUnknown;
  DataBuffer *lacedFrame;
  SafeReadIOCallback Mem;
  uint local_84;
  binary *local_80;
  KaxInternalBlock *local_78;
  undefined8 local_70;
  vector<int,_std::allocator<int>_> *local_68;
  DataBuffer *local_60;
  SafeReadIOCallback local_58;
  vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>> *local_40;
  filepos_t local_38;
  
  iVar10 = (*input->_vptr_IOCallback[5])(input);
  this->FirstFrameLocation = CONCAT44(extraout_var_00,iVar10);
  (this->super_EbmlBinary).super_EbmlElement.bValueIsSet = false;
  local_78 = this;
  if (ReadFully == SCOPE_PARTIAL_DATA) {
    iVar10 = (*input->_vptr_IOCallback[2])(input,&local_70,5);
    if (iVar10 != 5) {
      pEVar18 = (EndOfStreamX *)__cxa_allocate_exception(8);
      libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar18,0);
      __cxa_throw(pEVar18,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
    }
    bVar7 = (byte)local_70;
    this->TrackNumber = (ushort)(byte)local_70;
    if ((char)(byte)local_70 < '\0') {
      puVar32 = (ushort *)((long)&local_70 + 1);
      uVar8 = (byte)local_70 & 0x7f;
      lVar26 = 4;
    }
    else {
      if ((byte)local_70 < 0x40) {
        return 5;
      }
      puVar32 = (ushort *)((long)&local_70 + 2);
      uVar8 = ((byte)local_70 & 0x3f) << 8;
      this->TrackNumber = uVar8;
      uVar8 = local_70._1_1_ | uVar8;
      lVar26 = 5;
    }
    this->TrackNumber = uVar8;
    this->LocalTimecode = *puVar32 << 8 | *puVar32 >> 8;
    this->bLocalTimecodeUsed = true;
    iVar10 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[3])(this);
    bVar30 = (byte)puVar32[1];
    if ((*(long *)(KaxSimpleBlock::ClassInfos._8_8_ + 8) ==
         *(long *)((int *)CONCAT44(extraout_var_04,iVar10) + 2)) &&
       (*(int *)KaxSimpleBlock::ClassInfos._8_8_ == *(int *)CONCAT44(extraout_var_04,iVar10))) {
      this->bIsKeyframe = (bool)(bVar30 >> 7);
      this->bIsDiscardable = (bool)(bVar30 & 1);
    }
    LVar19 = bVar30 >> 1 & LACING_EBML;
    this->mInvisible = (bool)(bVar30 >> 3 & 1);
    this->mLacing = LVar19;
    if ((char)bVar7 < '\0') {
      uVar6 = local_70._4_1_;
      local_70 = (DataBuffer *)CONCAT71(local_70._1_7_,uVar6);
    }
    else {
      (*input->_vptr_IOCallback[2])(input,&local_70,1);
      LVar19 = this->mLacing;
    }
    this->FirstFrameLocation = this->FirstFrameLocation + lVar26;
    if (LVar19 == LACING_NONE) {
      std::vector<int,_std::allocator<int>_>::resize(&this->SizeList,1);
      iVar10 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      *(this->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start = iVar10 - (uint)lVar26;
    }
    else {
      iVar10 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      bVar7 = (byte)local_70;
      pbVar33 = (binary *)((ulong)local_70 & 0xff);
      this_00 = &this->SizeList;
      local_80 = pbVar33 + 1;
      std::vector<int,_std::allocator<int>_>::resize(this_00,(size_type)local_80);
      auVar4 = _DAT_0019d500;
      uVar27 = iVar10 + ~(uint)lVar26;
      LVar19 = this->mLacing;
      if (LVar19 == LACING_XIPH) {
        if (pbVar33 == (binary *)0x0) {
          piVar15 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar20 = 0;
        }
        else {
          pbVar24 = (binary *)0x0;
          local_80 = pbVar33;
          do {
            iVar10 = 0;
            uVar23 = uVar27;
            do {
              iVar11 = iVar10;
              (*input->_vptr_IOCallback[2])(input,&local_70,1);
              iVar10 = iVar11 + (uint)(byte)local_70;
              uVar23 = uVar23 - 1;
              uVar13 = local_78->FirstFrameLocation;
              local_78->FirstFrameLocation = uVar13 + 1;
            } while ((byte)local_70 == 0xff);
            local_78->FirstFrameLocation = uVar13 + 2;
            piVar15 = (local_78->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar15[(long)pbVar24] = iVar10;
            uVar27 = uVar23 - iVar10;
            pbVar24 = pbVar24 + 1;
          } while (pbVar24 != local_80);
          uVar20 = (ulong)local_80 & 0xffffffff;
          uVar27 = uVar23 - (iVar11 + (uint)(byte)local_70);
          this = local_78;
        }
        piVar15[uVar20] = uVar27;
      }
      else if (LVar19 == LACING_EBML) {
        local_60 = (DataBuffer *)CONCAT44(local_60._4_4_,uVar27);
        local_80 = (binary *)operator_new__((ulong)((uint)bVar7 * 4));
        (*input->_vptr_IOCallback[2])(input,local_80,(ulong)((uint)bVar7 * 4));
        uVar13 = libebml::ReadCodedSizeValue(local_80,(uint32 *)&local_60,(uint64 *)&local_58);
        piVar21 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        *piVar21 = (int)uVar13;
        pbVar29 = local_80 + ((ulong)local_60 & 0xffffffff);
        iVar10 = uVar27 - ((int)uVar13 + (int)local_60);
        pbVar24 = (binary *)0x1;
        if (1 < bVar7) {
          pbVar22 = (binary *)0x1;
          do {
            local_60 = (DataBuffer *)CONCAT44(local_60._4_4_,iVar10);
            iVar14 = libebml::ReadCodedSizeSignedValue
                               (pbVar29,(uint32 *)&local_60,(uint64 *)&local_58);
            uVar13 = iVar14 + (int)uVar13;
            piVar21 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            piVar21[(long)pbVar22] = (int)uVar13;
            pbVar29 = pbVar29 + ((ulong)local_60 & 0xffffffff);
            iVar10 = iVar10 - ((int)local_60 + (int)uVar13);
            pbVar22 = pbVar22 + 1;
            pbVar24 = pbVar33;
            this = local_78;
          } while (pbVar33 != pbVar22);
        }
        this->FirstFrameLocation = (uint64)(pbVar29 + (this->FirstFrameLocation - (long)local_80));
        piVar21[(long)pbVar24] = iVar10;
        operator_delete__(local_80);
      }
      else {
        if (LVar19 != LACING_FIXED) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                        ,0x2b2,
                        "virtual filepos_t libmatroska::KaxInternalBlock::ReadData(IOCallback &, ScopeMode)"
                       );
        }
        uVar20 = 0;
        uVar27 = uVar27 / (uint)local_80;
        piVar15 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        bVar30 = 1;
        if (1 < (byte)(bVar7 + 1)) {
          bVar30 = bVar7 + 1;
        }
        lVar26 = (ulong)(uint)bVar30 - 1;
        auVar35._8_4_ = (int)lVar26;
        auVar35._0_8_ = lVar26;
        auVar35._12_4_ = (int)((ulong)lVar26 >> 0x20);
        auVar35 = auVar35 ^ _DAT_0019d500;
        auVar38 = _DAT_001ad530;
        auVar37 = _DAT_0019d4f0;
        do {
          auVar39 = auVar37 ^ auVar4;
          iVar10 = auVar35._4_4_;
          if ((bool)(~(auVar39._4_4_ == iVar10 && auVar35._0_4_ < auVar39._0_4_ ||
                      iVar10 < auVar39._4_4_) & 1)) {
            *(uint *)((long)piVar15 + uVar20) = uVar27;
          }
          if ((auVar39._12_4_ != auVar35._12_4_ || auVar39._8_4_ <= auVar35._8_4_) &&
              auVar39._12_4_ <= auVar35._12_4_) {
            *(uint *)((long)piVar15 + uVar20 + 4) = uVar27;
          }
          auVar39 = auVar38 ^ auVar4;
          iVar11 = auVar39._4_4_;
          if (iVar11 <= iVar10 && (iVar11 != iVar10 || auVar39._0_4_ <= auVar35._0_4_)) {
            *(uint *)((long)piVar15 + uVar20 + 8) = uVar27;
            *(uint *)((long)piVar15 + uVar20 + 0xc) = uVar27;
          }
          lVar26 = auVar37._8_8_;
          auVar37._0_8_ = auVar37._0_8_ + 4;
          auVar37._8_8_ = lVar26 + 4;
          lVar26 = auVar38._8_8_;
          auVar38._0_8_ = auVar38._0_8_ + 4;
          auVar38._8_8_ = lVar26 + 4;
          uVar20 = uVar20 + 0x10;
        } while (((uint)bVar30 * 4 + 0xc & 0xfffffff0) != uVar20);
      }
    }
    (this->super_EbmlBinary).super_EbmlElement.bValueIsSet = false;
    iVar10 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    return CONCAT44(extraout_var_09,iVar10);
  }
  if (ReadFully != SCOPE_ALL_DATA) {
    iVar10 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    return CONCAT44(extraout_var_02,iVar10);
  }
  fVar12 = libebml::EbmlBinary::ReadData(&this->super_EbmlBinary,input,SCOPE_ALL_DATA);
  iVar10 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
  if (fVar12 != CONCAT44(extraout_var_01,iVar10)) {
    pEVar18 = (EndOfStreamX *)__cxa_allocate_exception(8);
    iVar10 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX
              (pEVar18,CONCAT44(extraout_var_10,iVar10) - fVar12);
    __cxa_throw(pEVar18,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
  }
  local_80 = (this->super_EbmlBinary).Data;
  libebml::SafeReadIOCallback::SafeReadIOCallback(&local_58,&this->super_EbmlBinary);
  bVar7 = libebml::SafeReadIOCallback::GetUInt8(&local_58);
  this->TrackNumber = (ushort)bVar7;
  if ((char)bVar7 < '\0') {
    uVar8 = (ushort)(bVar7 & 0x7f);
    uVar27 = 4;
  }
  else {
    if (bVar7 < 0x40) {
      pEVar18 = (EndOfStreamX *)__cxa_allocate_exception(8);
      libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar18,0);
      __cxa_throw(pEVar18,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
    }
    this->TrackNumber = (ushort)(bVar7 & 0x3f) << 8;
    bVar7 = libebml::SafeReadIOCallback::GetUInt8(&local_58);
    uVar8 = (ushort)bVar7 + this->TrackNumber;
    uVar27 = 5;
  }
  this->TrackNumber = uVar8;
  uVar9 = libebml::SafeReadIOCallback::GetUInt16BE(&local_58);
  this->LocalTimecode = uVar9;
  this->bLocalTimecodeUsed = true;
  bVar7 = libebml::SafeReadIOCallback::GetUInt8(&local_58);
  iVar10 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[3])(this);
  if ((*(long *)(KaxSimpleBlock::ClassInfos._8_8_ + 8) ==
       *(long *)((int *)CONCAT44(extraout_var_03,iVar10) + 2)) &&
     (*(int *)KaxSimpleBlock::ClassInfos._8_8_ == *(int *)CONCAT44(extraout_var_03,iVar10))) {
    this->bIsKeyframe = (bool)(bVar7 >> 7);
    this->bIsDiscardable = (bool)(bVar7 & 1);
  }
  this->mInvisible = (bool)(bVar7 >> 3 & 1);
  bVar7 = bVar7 >> 1 & 3;
  this->mLacing = (uint)bVar7;
  local_38 = fVar12;
  if (bVar7 == 0) {
    sVar16 = libebml::SafeReadIOCallback::GetPosition(&local_58);
    this->FirstFrameLocation = this->FirstFrameLocation + sVar16;
    pDVar17 = (DataBuffer *)operator_new(0x28);
    sVar16 = libebml::SafeReadIOCallback::GetPosition(&local_58);
    iVar10 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    pDVar17->_vptr_DataBuffer = (_func_int **)&PTR__DataBuffer_001ce5b0;
    pDVar17->mySize = iVar10 - uVar27;
    pDVar17->bValidValue = true;
    pDVar17->myFreeBuffer = (_func_bool_DataBuffer_ptr *)0x0;
    pDVar17->bInternalBuffer = false;
    pDVar17->myBuffer = local_80 + sVar16;
    iVar3._M_current =
         (this->myBuffers).
         super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_70 = pDVar17;
    if (iVar3._M_current ==
        (this->myBuffers).
        super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>>::
      _M_realloc_insert<libmatroska::DataBuffer*const&>
                ((vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>> *)
                 &this->myBuffers,iVar3,(DataBuffer **)&local_70);
    }
    else {
      *iVar3._M_current = pDVar17;
      pppDVar1 = &(this->myBuffers).
                  super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppDVar1 = *pppDVar1 + 1;
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->SizeList,1);
    iVar10 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    *(this->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = iVar10 - uVar27;
    goto LAB_0018b4fd;
  }
  iVar10 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
  bVar7 = libebml::SafeReadIOCallback::GetUInt8(&local_58);
  pvVar31 = (vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>> *)
            (CONCAT71(extraout_var,bVar7) & 0xffffffff);
  local_68 = &this->SizeList;
  uVar20 = (ulong)bVar7;
  std::vector<int,_std::allocator<int>_>::resize(local_68,(ulong)(bVar7 + 1));
  auVar4 = _DAT_0019d500;
  uVar27 = iVar10 + ~uVar27;
  LVar19 = this->mLacing;
  bVar30 = (byte)pvVar31;
  if (LVar19 == LACING_XIPH) {
    if (bVar30 == 0) {
      piVar15 = (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar20 = 0;
    }
    else {
      uVar28 = 0;
      local_40 = pvVar31;
      do {
        iVar10 = 0;
        uVar23 = uVar27;
        do {
          iVar11 = iVar10;
          bVar7 = libebml::SafeReadIOCallback::GetUInt8(&local_58);
          iVar10 = iVar11 + (uint)bVar7;
          uVar23 = uVar23 - 1;
        } while (bVar7 == 0xff);
        piVar15 = (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar15[uVar28] = iVar10;
        uVar27 = uVar23 - iVar10;
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar20);
      uVar27 = uVar23 - (iVar11 + (uint)bVar7);
      this = local_78;
      pvVar31 = local_40;
    }
    piVar15[uVar20] = uVar27;
  }
  else if (LVar19 == LACING_EBML) {
    local_84 = uVar27;
    sVar16 = libebml::SafeReadIOCallback::GetPosition(&local_58);
    uVar13 = libebml::ReadCodedSizeValue(local_80 + sVar16,&local_84,&local_70);
    iVar10 = (int)uVar13;
    if ((iVar10 == 0) || (uVar27 < local_84 + iVar10)) {
      pEVar18 = (EndOfStreamX *)__cxa_allocate_exception(8);
      libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar18,(ulong)local_84);
LAB_0018b61a:
      __cxa_throw(pEVar18,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
    }
    *(local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
     _M_start = iVar10;
    libebml::SafeReadIOCallback::Skip(&local_58,(ulong)local_84);
    uVar27 = uVar27 - (local_84 + iVar10);
    if (bVar30 < 2) {
      uVar20 = 1;
      if (bVar30 == 0) goto LAB_0018b43b;
    }
    else {
      uVar28 = 1;
      local_40 = pvVar31;
      do {
        local_84 = uVar27;
        sVar16 = libebml::SafeReadIOCallback::GetPosition(&local_58);
        iVar14 = libebml::ReadCodedSizeSignedValue(local_80 + sVar16,&local_84,&local_70);
        uVar13 = iVar14 + (int)uVar13;
        iVar10 = (int)uVar13;
        if ((iVar10 == 0) || (uVar27 < local_84 + iVar10)) {
          pEVar18 = (EndOfStreamX *)__cxa_allocate_exception(8);
          libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar18,(ulong)local_84);
          goto LAB_0018b61a;
        }
        (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar28] = iVar10;
        libebml::SafeReadIOCallback::Skip(&local_58,(ulong)local_84);
        uVar27 = uVar27 - (local_84 + iVar10);
        uVar28 = uVar28 + 1;
        pvVar31 = local_40;
      } while (uVar20 != uVar28);
    }
    (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start[uVar20] = uVar27;
  }
  else {
    if (LVar19 != LACING_FIXED) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0x22e,
                    "virtual filepos_t libmatroska::KaxInternalBlock::ReadData(IOCallback &, ScopeMode)"
                   );
    }
    uVar20 = 0;
    uVar27 = uVar27 / (bVar7 + 1);
    piVar15 = (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar25 = (int)CONCAT71(extraout_var,bVar7) + 1;
    uVar23 = 1;
    if (1 < (byte)uVar25) {
      uVar23 = uVar25 & 0xff;
    }
    lVar26 = (ulong)uVar23 - 1;
    auVar34._8_4_ = (int)lVar26;
    auVar34._0_8_ = lVar26;
    auVar34._12_4_ = (int)((ulong)lVar26 >> 0x20);
    auVar34 = auVar34 ^ _DAT_0019d500;
    auVar39 = _DAT_001ad530;
    auVar36 = _DAT_0019d4f0;
    do {
      auVar38 = auVar36 ^ auVar4;
      iVar10 = auVar34._4_4_;
      if ((bool)(~(auVar38._4_4_ == iVar10 && auVar34._0_4_ < auVar38._0_4_ ||
                  iVar10 < auVar38._4_4_) & 1)) {
        *(uint *)((long)piVar15 + uVar20) = uVar27;
      }
      if ((auVar38._12_4_ != auVar34._12_4_ || auVar38._8_4_ <= auVar34._8_4_) &&
          auVar38._12_4_ <= auVar34._12_4_) {
        *(uint *)((long)piVar15 + uVar20 + 4) = uVar27;
      }
      auVar38 = auVar39 ^ auVar4;
      iVar11 = auVar38._4_4_;
      if (iVar11 <= iVar10 && (iVar11 != iVar10 || auVar38._0_4_ <= auVar34._0_4_)) {
        *(uint *)((long)piVar15 + uVar20 + 8) = uVar27;
        *(uint *)((long)piVar15 + uVar20 + 0xc) = uVar27;
      }
      lVar26 = auVar36._8_8_;
      auVar36._0_8_ = auVar36._0_8_ + 4;
      auVar36._8_8_ = lVar26 + 4;
      lVar26 = auVar39._8_8_;
      auVar39._0_8_ = auVar39._0_8_ + 4;
      auVar39._8_8_ = lVar26 + 4;
      uVar20 = uVar20 + 0x10;
    } while ((uVar23 * 4 + 0xc & 0xfffffff0) != uVar20);
  }
LAB_0018b43b:
  sVar16 = libebml::SafeReadIOCallback::GetPosition(&local_58);
  this->FirstFrameLocation = this->FirstFrameLocation + sVar16;
  local_40 = (vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>> *)
             &this->myBuffers;
  bVar7 = 0;
  do {
    pDVar17 = (DataBuffer *)operator_new(0x28);
    sVar16 = libebml::SafeReadIOCallback::GetPosition(&local_58);
    uVar2 = (local_78->SizeList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[bVar7];
    pDVar17->_vptr_DataBuffer = (_func_int **)&PTR__DataBuffer_001ce5b0;
    pDVar17->mySize = uVar2;
    pDVar17->bValidValue = true;
    pDVar17->myFreeBuffer = (_func_bool_DataBuffer_ptr *)0x0;
    pDVar17->bInternalBuffer = false;
    pDVar17->myBuffer = local_80 + sVar16;
    iVar3._M_current =
         (local_78->myBuffers).
         super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_60 = pDVar17;
    if (iVar3._M_current ==
        (local_78->myBuffers).
        super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<libmatroska::DataBuffer*,std::allocator<libmatroska::DataBuffer*>>::
      _M_realloc_insert<libmatroska::DataBuffer*const&>(local_40,iVar3,&local_60);
    }
    else {
      *iVar3._M_current = pDVar17;
      pppDVar1 = &(local_78->myBuffers).
                  super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppDVar1 = *pppDVar1 + 1;
    }
    libebml::SafeReadIOCallback::Skip
              (&local_58,
               (long)(local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[bVar7]);
    bVar7 = bVar7 + 1;
    this = local_78;
  } while (bVar7 <= (byte)pvVar31);
LAB_0018b4fd:
  iVar10 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
  pbVar33 = local_80 + CONCAT44(extraout_var_05,iVar10);
  uVar28 = (long)(this->myBuffers).
                 super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->myBuffers).
                 super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar20 = 1;
  do {
    pKVar5 = local_78;
    if (uVar20 - uVar28 == 1) {
      (local_78->super_EbmlBinary).super_EbmlElement.bValueIsSet = true;
      libebml::SafeReadIOCallback::~SafeReadIOCallback(&local_58);
      return local_38;
    }
    iVar10 = (*(local_78->myBuffers).
               super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar20 - 1]->_vptr_DataBuffer[2])();
    iVar11 = (*(pKVar5->myBuffers).
               super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar20 - 1]->_vptr_DataBuffer[3])();
    uVar27 = *(uint *)CONCAT44(extraout_var_07,iVar11);
    pbVar24 = pbVar33;
    if (uVar20 < uVar28) {
      iVar11 = (*(local_78->myBuffers).
                 super__Vector_base<libmatroska::DataBuffer_*,_std::allocator<libmatroska::DataBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar20]->_vptr_DataBuffer[2])();
      pbVar24 = (binary *)CONCAT44(extraout_var_08,iVar11);
    }
  } while (((local_80 <= (binary *)CONCAT44(extraout_var_06,iVar10)) &&
           (pbVar29 = (binary *)CONCAT44(extraout_var_06,iVar10) + uVar27, pbVar29 <= pbVar33)) &&
          (uVar20 = uVar20 + 1, pbVar29 == pbVar24));
  pEVar18 = (EndOfStreamX *)__cxa_allocate_exception(8);
  libebml::SafeReadIOCallback::EndOfStreamX::EndOfStreamX(pEVar18,0);
  __cxa_throw(pEVar18,&libebml::SafeReadIOCallback::EndOfStreamX::typeinfo,0);
}

Assistant:

filepos_t KaxInternalBlock::ReadData(IOCallback & input, ScopeMode ReadFully)
{
  filepos_t Result;

  FirstFrameLocation = input.getFilePointer(); // will be updated accordingly below

  SetValueIsSet(false);

  try {
    if (ReadFully == SCOPE_ALL_DATA) {
      Result = EbmlBinary::ReadData(input, ReadFully);
      if (Result != GetSize())
        throw SafeReadIOCallback::EndOfStreamX(GetSize() - Result);

      binary *BufferStart = EbmlBinary::GetBuffer();

      SafeReadIOCallback Mem(*this);
      uint8 BlockHeadSize = 4;

      // update internal values
      TrackNumber = Mem.GetUInt8();
      if ((TrackNumber & 0x80) == 0) {
        // there is extra data
        if ((TrackNumber & 0x40) == 0) {
          // We don't support track numbers that large !
          throw SafeReadIOCallback::EndOfStreamX(0);
        }
        TrackNumber = (TrackNumber & 0x3F) << 8;
        TrackNumber += Mem.GetUInt8();
        BlockHeadSize++;
      } else {
        TrackNumber &= 0x7F;
      }

      LocalTimecode = int16(Mem.GetUInt16BE());
      bLocalTimecodeUsed = true;

      uint8 Flags = Mem.GetUInt8();
      if (EbmlId(*this) == EBML_ID(KaxSimpleBlock)) {
        bIsKeyframe = (Flags & 0x80) != 0;
        bIsDiscardable = (Flags & 0x01) != 0;
      }
      mInvisible = (Flags & 0x08) >> 3;
      mLacing = LacingType((Flags & 0x06) >> 1);

      // put all Frames in the list
      if (mLacing == LACING_NONE) {
        FirstFrameLocation += Mem.GetPosition();
        DataBuffer * soloFrame = new DataBuffer(BufferStart + Mem.GetPosition(), GetSize() - BlockHeadSize);
        myBuffers.push_back(soloFrame);
        SizeList.resize(1);
        SizeList[0] = GetSize() - BlockHeadSize;
      } else {
        // read the number of frames in the lace
        uint32 LastBufferSize = GetSize() - BlockHeadSize - 1; // 1 for number of frame
        uint8 FrameNum = Mem.GetUInt8(); // number of frames in the lace - 1
        // read the list of frame sizes
        uint8 Index;
        int32 FrameSize;
        uint32 SizeRead;
        uint64 SizeUnknown;

        SizeList.resize(FrameNum + 1);

        switch (mLacing) {
          case LACING_XIPH:
            for (Index=0; Index<FrameNum; Index++) {
              // get the size of the frame
              FrameSize = 0;
              uint8 Value;
              do {
                Value = Mem.GetUInt8();
                FrameSize += Value;
                LastBufferSize--;
              } while (Value == 0xFF);
              SizeList[Index] = FrameSize;
              LastBufferSize -= FrameSize;
            }
            SizeList[Index] = LastBufferSize;
            break;
          case LACING_EBML:
            SizeRead = LastBufferSize;
            FrameSize = ReadCodedSizeValue(BufferStart + Mem.GetPosition(), SizeRead, SizeUnknown);
            if (!FrameSize || (static_cast<uint32>(FrameSize + SizeRead) > LastBufferSize))
              throw SafeReadIOCallback::EndOfStreamX(SizeRead);
            SizeList[0] = FrameSize;
            Mem.Skip(SizeRead);
            LastBufferSize -= FrameSize + SizeRead;

            for (Index=1; Index<FrameNum; Index++) {
              // get the size of the frame
              SizeRead = LastBufferSize;
              FrameSize += ReadCodedSizeSignedValue(BufferStart + Mem.GetPosition(), SizeRead, SizeUnknown);
              if (!FrameSize || (static_cast<uint32>(FrameSize + SizeRead) > LastBufferSize))
                throw SafeReadIOCallback::EndOfStreamX(SizeRead);
              SizeList[Index] = FrameSize;
              Mem.Skip(SizeRead);
              LastBufferSize -= FrameSize + SizeRead;
            }
            if (Index <= FrameNum) // Safety check if FrameNum == 0
              SizeList[Index] = LastBufferSize;
            break;
          case LACING_FIXED:
            for (Index=0; Index<=FrameNum; Index++) {
              // get the size of the frame
              SizeList[Index] = LastBufferSize / (FrameNum + 1);
            }
            break;
          default: // other lacing not supported
            assert(0);
        }

        FirstFrameLocation += Mem.GetPosition();

        for (Index=0; Index<=FrameNum; Index++) {
          DataBuffer * lacedFrame = new DataBuffer(BufferStart + Mem.GetPosition(), SizeList[Index]);
          myBuffers.push_back(lacedFrame);
          Mem.Skip(SizeList[Index]);
        }
      }

      binary *BufferEnd = BufferStart + GetSize();
      size_t NumFrames  = myBuffers.size();

      // Sanity checks for frame pointers and boundaries.
      for (size_t Index = 0; Index < NumFrames; ++Index) {
        binary *FrameStart  = myBuffers[Index]->Buffer();
        binary *FrameEnd    = FrameStart + myBuffers[Index]->Size();
        binary *ExpectedEnd = (Index + 1) < NumFrames ? myBuffers[Index + 1]->Buffer() : BufferEnd;

        if ((FrameStart < BufferStart) || (FrameEnd > BufferEnd) || (FrameEnd != ExpectedEnd))
          throw SafeReadIOCallback::EndOfStreamX(0);
      }

      SetValueIsSet();
    } else if (ReadFully == SCOPE_PARTIAL_DATA) {
      binary _TempHead[5];
      Result = input.read(_TempHead, 5);
      if (Result != 5)
        throw SafeReadIOCallback::EndOfStreamX(0);
      binary *cursor = _TempHead;
      binary *_tmpBuf;
      uint8 BlockHeadSize = 4;

      // update internal values
      TrackNumber = *cursor++;
      if ((TrackNumber & 0x80) == 0) {
        // there is extra data
        if ((TrackNumber & 0x40) == 0) {
          // We don't support track numbers that large !
          return Result;
        }
        TrackNumber = (TrackNumber & 0x3F) << 8;
        TrackNumber += *cursor++;
        BlockHeadSize++;
      } else {
        TrackNumber &= 0x7F;
      }

      big_int16 b16;
      b16.Eval(cursor);
      LocalTimecode = int16(b16);
      bLocalTimecodeUsed = true;
      cursor += 2;

      if (EbmlId(*this) == EBML_ID(KaxSimpleBlock)) {
        bIsKeyframe = (*cursor & 0x80) != 0;
        bIsDiscardable = (*cursor & 0x01) != 0;
      }
      mInvisible = (*cursor & 0x08) >> 3;
      mLacing = LacingType((*cursor++ & 0x06) >> 1);
      if (cursor == &_TempHead[4]) {
        _TempHead[0] = _TempHead[4];
      } else {
        Result += input.read(_TempHead, 1);
      }

      FirstFrameLocation += cursor - _TempHead;

      // put all Frames in the list
      if (mLacing != LACING_NONE) {
        // read the number of frames in the lace
        uint32 LastBufferSize = GetSize() - BlockHeadSize - 1; // 1 for number of frame
        uint8 FrameNum = _TempHead[0]; // number of frames in the lace - 1
        // read the list of frame sizes
        uint8 Index;
        int32 FrameSize;
        uint32 SizeRead;
        uint64 SizeUnknown;

        SizeList.resize(FrameNum + 1);

        switch (mLacing) {
          case LACING_XIPH:
            for (Index=0; Index<FrameNum; Index++) {
              // get the size of the frame
              FrameSize = 0;
              do {
                Result += input.read(_TempHead, 1);
                FrameSize += uint8(_TempHead[0]);
                LastBufferSize--;

                FirstFrameLocation++;
              } while (_TempHead[0] == 0xFF);

              FirstFrameLocation++;
              SizeList[Index] = FrameSize;
              LastBufferSize -= FrameSize;
            }
            SizeList[Index] = LastBufferSize;
            break;
          case LACING_EBML:
            SizeRead = LastBufferSize;
            cursor = _tmpBuf = new binary[FrameNum*4]; /// \warning assume the mean size will be coded in less than 4 bytes
            Result += input.read(cursor, FrameNum*4);
            FrameSize = ReadCodedSizeValue(cursor, SizeRead, SizeUnknown);
            SizeList[0] = FrameSize;
            cursor += SizeRead;
            LastBufferSize -= FrameSize + SizeRead;

            for (Index=1; Index<FrameNum; Index++) {
              // get the size of the frame
              SizeRead = LastBufferSize;
              FrameSize += ReadCodedSizeSignedValue(cursor, SizeRead, SizeUnknown);
              SizeList[Index] = FrameSize;
              cursor += SizeRead;
              LastBufferSize -= FrameSize + SizeRead;
            }

            FirstFrameLocation += cursor - _tmpBuf;

            SizeList[Index] = LastBufferSize;
            delete [] _tmpBuf;
            break;
          case LACING_FIXED:
            for (Index=0; Index<=FrameNum; Index++) {
              // get the size of the frame
              SizeList[Index] = LastBufferSize / (FrameNum + 1);
            }
            break;
          default: // other lacing not supported
            assert(0);
        }
      } else {
        SizeList.resize(1);
        SizeList[0] = GetSize() - BlockHeadSize;
      }
      SetValueIsSet(false);
      Result = GetSize();
    } else {
      SetValueIsSet(false);
      Result = GetSize();
    }

  } catch (SafeReadIOCallback::EndOfStreamX &) {
    SetValueIsSet(false);

    std::memset(EbmlBinary::GetBuffer(), 0, GetSize());
    myBuffers.clear();
    SizeList.clear();
    Timecode           = 0;
    LocalTimecode      = 0;
    TrackNumber        = 0;
    bLocalTimecodeUsed = false;
    FirstFrameLocation = 0;

    return 0;
  }

  return Result;
}